

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

bool __thiscall QMakeSourceFileInfo::findMocs(QMakeSourceFileInfo *this,SourceFile *file)

{
  char *__s;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QString *pQVar8;
  char *buffer;
  long lVar9;
  size_t sVar10;
  long lVar11;
  size_t __n;
  int buffer_len;
  char16_t *pcVar12;
  char (*__s_00) [19];
  ulong uVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  bool bVar15;
  int extralines_1;
  int extralines;
  int line_count;
  bool ignore [5];
  int morelines;
  int local_8c;
  int local_88;
  uint local_84;
  QMakeLocalFileName local_80;
  char local_50 [8];
  undefined1 *local_48;
  undefined4 uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if ((file->field_0x3c & 8) == 0) {
    this->files_changed = true;
    file->field_0x3c = file->field_0x3c | 8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    (**this->_vptr_QMakeSourceFileInfo)(&local_80,this,file);
    pQVar8 = QMakeLocalFileName::local(&local_80);
    QFile::QFile((QFile *)&local_48,(QString *)pQVar8);
    if (&(local_80.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_80.local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar4 = QFile::open(&local_48,1);
    if (cVar4 == '\0') {
      QFile::~QFile((QFile *)&local_48);
    }
    else {
      iVar6 = QFile::size();
      buffer = getBuffer(this,iVar6);
      iVar6 = 0;
      do {
        buffer_len = iVar6;
        iVar7 = QIODevice::read((char *)&local_48,(longlong)(buffer + buffer_len));
        iVar6 = buffer_len + iVar7;
      } while (iVar7 != 0);
      QFile::~QFile((QFile *)&local_48);
      if (cVar4 != '\0') {
        if (Option::debug_level != 0) {
          QMakeLocalFileName::local(&file->file);
          QString::toLatin1_helper((QString *)&local_80);
          pcVar12 = local_80.real_name.d.ptr;
          if (local_80.real_name.d.ptr == (char16_t *)0x0) {
            pcVar12 = (char16_t *)&QByteArray::_empty;
          }
          debug_msg_internal(2,"findMocs: %s",pcVar12);
          if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        local_84 = 1;
        local_50[4] = 0;
        local_50[0] = '\0';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
        if (0 < buffer_len) {
          bVar3 = false;
          iVar6 = 0;
          do {
            iVar6 = skipEscapedLineEnds(buffer,buffer_len,iVar6,(int *)&local_84);
            cVar4 = buffer[iVar6];
            if ((cVar4 == '\"') || (cVar4 == '\'')) {
              iVar6 = scanPastString(buffer,buffer_len,iVar6,(int *)&local_84);
            }
            else if (cVar4 == '/') {
              local_88 = 0;
              iVar7 = skipEscapedLineEnds(buffer,buffer_len,iVar6 + 1,&local_88);
              if (iVar7 < buffer_len) {
                if (buffer[iVar7] == '*') {
                  local_84 = local_84 + local_88;
                  do {
                    while( true ) {
                      iVar7 = skipEscapedLineEnds(buffer,buffer_len,iVar7 + 1,(int *)&local_84);
                      iVar6 = iVar7;
                      if (buffer_len <= iVar7) goto LAB_0019640f;
                      cVar4 = buffer[iVar7];
                      if (cVar4 == '*') break;
                      if ((cVar4 == 't') || (cVar4 == 'q')) {
                        local_48 = (undefined1 *)0x6e676920656b616d;
                        uStack_40 = 0x2065726f;
                        uStack_3c = uStack_3c & 0xffffff00;
                        pcVar14 = local_50;
                        lVar9 = 0;
                        do {
                          __s = findMocs::keywords[0] + lVar9;
                          sVar10 = strlen(__s);
                          if ((int)sVar10 + iVar7 + 0xc <= buffer_len) {
                            __n = strlen((char *)&local_48);
                            iVar6 = strncmp(buffer + (long)iVar7 + 1,(char *)&local_48,__n);
                            if ((iVar6 == 0) &&
                               (iVar6 = strncmp(buffer + (long)iVar7 + 0xd,__s,sVar10), iVar6 == 0))
                            {
                              if (Option::debug_level != 0) {
                                QString::toLatin1_helper((QString *)&local_80);
                                pcVar12 = local_80.real_name.d.ptr;
                                if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                                  pcVar12 = (char16_t *)&QByteArray::_empty;
                                }
                                debug_msg_internal(2,"Mocgen: %s:%d Found \"q%s%s\"",pcVar12,
                                                   (ulong)local_84,&local_48,__s);
                                if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0
                                   ) {
                                  LOCK();
                                  ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i =
                                       ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i == 0) {
                                    QArrayData::deallocate
                                              (&(local_80.real_name.d.d)->super_QArrayData,1,0x10);
                                  }
                                }
                              }
                              sVar10 = strlen(__s);
                              iVar7 = iVar7 + (int)sVar10 + 0xc;
                              *pcVar14 = '\x01';
                            }
                          }
                          lVar9 = lVar9 + 0x13;
                          pcVar14 = pcVar14 + 1;
                        } while (lVar9 != 0x5f);
                      }
                      else if ((Option::debug_level != 0) && ((cVar4 == '\r' || (cVar4 == '\n')))) {
                        local_84 = local_84 + 1;
                      }
                    }
                    local_88 = 0;
                    iVar6 = skipEscapedLineEnds(buffer,buffer_len,iVar7 + 1,&local_88);
                  } while ((buffer_len <= iVar6) || (buffer[iVar6] != '/'));
                  local_84 = local_84 + local_88;
                }
                else if (buffer[iVar7] == '/') {
                  local_84 = local_84 + local_88;
                  iVar6 = iVar7;
                  do {
                    iVar6 = skipEscapedLineEnds(buffer,buffer_len,iVar6 + 1,(int *)&local_84);
                    if ((buffer_len <= iVar6) || (buffer[iVar6] == '\n')) break;
                  } while (buffer[iVar6] != '\r');
                }
              }
            }
LAB_0019640f:
            if (((iVar6 < buffer_len) && (Option::debug_level != 0)) &&
               ((buffer[iVar6] == '\r' || (buffer[iVar6] == '\n')))) {
              local_84 = local_84 + 1;
            }
            if ((((iVar6 + 8 < buffer_len) && (bVar1 = buffer[iVar6], 9 < (byte)(bVar1 - 0x30))) &&
                (bVar1 != 0x5f)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
              local_48 = (undefined1 *)((ulong)local_48 & 0xffffffff00000000);
              iVar7 = skipEscapedLineEnds(buffer,buffer_len,iVar6 + 1,(int *)&local_48);
              lVar9 = (long)iVar7;
              bVar15 = true;
              if (buffer[lVar9] == 'Q') {
                uVar13 = 0;
                __s_00 = findMocs::keywords;
                bVar15 = false;
                do {
                  if (local_50[uVar13] == '\0') {
                    local_88 = 0;
                    local_8c = 0;
                    sVar10 = strlen(*__s_00);
                    bVar5 = matchWhileUnsplitting
                                      (buffer,buffer_len,iVar7,*__s_00,(int)sVar10,&local_88,
                                       &local_8c);
                    bVar2 = true;
                    if (((bVar5) && (lVar11 = local_88 + lVar9, (int)lVar11 < buffer_len)) &&
                       ((bVar1 = buffer[lVar11], 9 < (byte)(bVar1 - 0x30) &&
                        ((bVar1 != 0x5f && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))))) {
                      if ((Option::debug_level != 0) &&
                         (buffer[lVar11] = '\0', Option::debug_level != 0)) {
                        QString::toLatin1_helper((QString *)&local_80);
                        pcVar12 = local_80.real_name.d.ptr;
                        if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                          pcVar12 = (char16_t *)&QByteArray::_empty;
                        }
                        debug_msg_internal(2,"Mocgen: %s:%d Found MOC symbol %s",pcVar12,
                                           (ulong)((int)local_48 + local_84),buffer + lVar9);
                        if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i =
                               ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate
                                      (&(local_80.real_name.d.d)->super_QArrayData,1,0x10);
                          }
                        }
                      }
                      file->field_0x3c = file->field_0x3c | 1;
                      bVar3 = true;
                      bVar2 = false;
                    }
                    if (!bVar2) break;
                  }
                  bVar15 = 3 < uVar13;
                  uVar13 = uVar13 + 1;
                  __s_00 = __s_00 + 1;
                } while (uVar13 != 5);
              }
              if (!bVar15) goto LAB_0019684a;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < buffer_len);
        }
        bVar3 = true;
        goto LAB_0019684a;
      }
    }
    bVar3 = false;
  }
LAB_0019684a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QMakeSourceFileInfo::findMocs(SourceFile *file)
{
    if(file->moc_checked)
        return true;
    files_changed = true;
    file->moc_checked = true;

    int buffer_len = 0;
    char *buffer = nullptr;
    {
        QFile f(fixPathForFile(file->file, true).local());
        if (!f.open(QIODevice::ReadOnly))
            return false; //shouldn't happen
        const qint64 fs = f.size();
        buffer = getBuffer(fs);
        while (int have_read = f.read(buffer + buffer_len, fs - buffer_len))
            buffer_len += have_read;
    }

    debug_msg(2, "findMocs: %s", file->file.local().toLatin1().constData());
    int line_count = 1;
    enum Keywords {
        Q_OBJECT_Keyword,
        Q_GADGET_Keyword,
        Q_GADGET_EXPORT_Keyword,
        Q_NAMESPACE_Keyword,
        Q_NAMESPACE_EXPORT_Keyword,

        NumKeywords
    };
    static const char keywords[][19] = {
        "Q_OBJECT",
        "Q_GADGET",
        "Q_GADGET_EXPORT",
        "Q_NAMESPACE",
        "Q_NAMESPACE_EXPORT",
    };
    static_assert(std::size(keywords) == NumKeywords);
    bool ignore[NumKeywords] = {};
 /* qmake ignore Q_GADGET */
 /* qmake ignore Q_GADGET_EXPORT */
 /* qmake ignore Q_OBJECT */
 /* qmake ignore Q_NAMESPACE */
 /* qmake ignore Q_NAMESPACE_EXPORT */
    for(int x = 0; x < buffer_len; x++) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), &line_count)
        x = SKIP_BSNL(x);
        if (buffer[x] == '/') {
            int extralines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
            if (buffer_len > y) {
                // If comment, advance to the character that ends it:
                if (buffer[y] == '/') { // C++-style comment
                    line_count += extralines;
                    x = y;
                    do {
                        x = SKIP_BSNL(x + 1);
                    } while (x < buffer_len && !qmake_endOfLine(buffer[x]));

                } else if (buffer[y] == '*') { // C-style comment
                    line_count += extralines;
                    x = SKIP_BSNL(y + 1);
                    for (; x < buffer_len; x = SKIP_BSNL(x + 1)) {
                        if (buffer[x] == 't' || buffer[x] == 'q') { // ignore
                            const char tag[] = "make ignore ";
                            const auto starts_with = [](const char *haystack, const char *needle) {
                                return strncmp(haystack, needle, strlen(needle)) == 0;
                            };
                            const auto is_ignore = [&](const char *keyword) {
                                return buffer_len >= int(x + strlen(tag) + strlen(keyword)) &&
                                        starts_with(buffer + x + 1, tag) &&
                                        starts_with(buffer + x + 1 + strlen(tag), keyword);
                            };
                            int interest = 0;
                            for (const char *keyword : keywords) {
                                if (is_ignore(keyword)){
                                    debug_msg(2, "Mocgen: %s:%d Found \"q%s%s\"",
                                              file->file.real().toLatin1().constData(), line_count,
                                              tag, keyword);
                                    x += static_cast<int>(strlen(tag));
                                    x += static_cast<int>(strlen(keyword));
                                    ignore[interest] = true;
                                }
                                ++interest;
                            }
                        } else if (buffer[x] == '*') {
                            extralines = 0;
                            y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
                            if (buffer_len > y && buffer[y] == '/') {
                                line_count += extralines;
                                x = y;
                                break;
                            }
                        } else if (Option::debug_level && qmake_endOfLine(buffer[x])) {
                            ++line_count;
                        }
                    }
                }
                // else: don't update x, buffer[x] is just the division operator.
            }
        } else if (buffer[x] == '\'' || buffer[x] == '"') {
            x = scanPastString(buffer, buffer_len, x, &line_count);
            // Leaves us on closing quote; for loop's x++ steps us past it.
        }

        if (x < buffer_len && Option::debug_level && qmake_endOfLine(buffer[x]))
            ++line_count;
        if (buffer_len > x + 8 && !isCWordChar(buffer[x])) {
            int morelines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &morelines);
            if (buffer[y] == 'Q') {
                for (int interest = 0; interest < NumKeywords; ++interest) {
                    if (ignore[interest])
                        continue;

                    int matchlen = 0, extralines = 0;
                    size_t needle_len = strlen(keywords[interest]);
                    Q_ASSERT(needle_len <= INT_MAX);
                    if (matchWhileUnsplitting(buffer, buffer_len, y,
                                              keywords[interest],
                                              static_cast<int>(needle_len),
                                              &matchlen, &extralines)
                        && y + matchlen < buffer_len
                        && !isCWordChar(buffer[y + matchlen])) {
                        if (Option::debug_level) {
                            buffer[y + matchlen] = '\0';
                            debug_msg(2, "Mocgen: %s:%d Found MOC symbol %s",
                                      file->file.real().toLatin1().constData(),
                                      line_count + morelines, buffer + y);
                        }
                        file->mocable = true;
                        return true;
                    }
                }
            }
        }
#undef SKIP_BSNL
    }
    return true;
}